

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

find_escape_result<char> *
fmt::v10::detail::find_escape
          (find_escape_result<char> *__return_storage_ptr__,char *begin,char *end)

{
  char *s;
  bool bVar1;
  type count;
  anon_class_8_1_6971b95b_for_f f;
  string_view s_00;
  basic_string_view<char> local_28;
  find_escape_result<char> *local_18;
  char *end_local;
  char *begin_local;
  
  local_18 = (find_escape_result<char> *)end;
  end_local = begin;
  bVar1 = is_utf8();
  s = end_local;
  if (bVar1) {
    __return_storage_ptr__->begin = (char *)local_18;
    __return_storage_ptr__->end = (char *)0x0;
    __return_storage_ptr__->cp = 0;
    f.result = local_18;
    count = to_unsigned<long>((long)local_18 - (long)end_local);
    basic_string_view<char>::basic_string_view(&local_28,s,count);
    s_00.size_ = (size_t)__return_storage_ptr__;
    s_00.data_ = (char *)local_28.size_;
    for_each_codepoint<fmt::v10::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v10::basic_string_view<char>)_1_>
              ((detail *)local_28.data_,s_00,f);
  }
  else {
    find_escape<char>(__return_storage_ptr__,end_local,(char *)local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto find_escape(const char* begin, const char* end)
    -> find_escape_result<char> {
  if (!is_utf8()) return find_escape<char>(begin, end);
  auto result = find_escape_result<char>{end, nullptr, 0};
  for_each_codepoint(string_view(begin, to_unsigned(end - begin)),
                     [&](uint32_t cp, string_view sv) {
                       if (needs_escape(cp)) {
                         result = {sv.begin(), sv.end(), cp};
                         return false;
                       }
                       return true;
                     });
  return result;
}